

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall cs::token_arglist::dump(token_arglist *this,ostream *o)

{
  _Elt_pointer ptVar1;
  tree_type<cs::token_base_*> *tree;
  _Elt_pointer ptVar2;
  _Elt_pointer ptVar3;
  _Map_pointer local_38;
  
  std::operator<<(o,"< ArgumentList = {");
  ptVar2 = (this->mTreeList).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ptVar3 = (this->mTreeList).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (this->mTreeList).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar1 = (this->mTreeList).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (ptVar2 != ptVar1) {
    std::operator<<(o,"< ChildExpression: ");
    compiler_type::dump_expr(ptVar2->mRoot,o);
    std::operator<<(o," >");
    ptVar2 = ptVar2 + 1;
    if (ptVar2 == ptVar3) {
      ptVar2 = local_38[1];
      local_38 = local_38 + 1;
      ptVar3 = ptVar2 + 0x40;
    }
  }
  std::operator<<(o,"} >");
  return true;
}

Assistant:

bool token_arglist::dump(std::ostream &o) const
	{
		o << "< ArgumentList = {";
		for (auto &tree: mTreeList) {
			o << "< ChildExpression: ";
			compiler_type::dump_expr(tree.root(), o);
			o << " >";
		}
		o << "} >";
		return true;
	}